

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall
QGraphicsView::render
          (QGraphicsView *this,QPainter *painter,QRectF *target,QRect *source,
          AspectRatioMode aspectRatioMode)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  QWidgetData *pQVar2;
  QGraphicsScene *this_01;
  QGraphicsItemPrivate *this_02;
  qsizetype qVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QWidget *pQVar8;
  long *plVar9;
  void *pvVar10;
  QGraphicsItem **ppQVar11;
  QTransform *pQVar12;
  QStyleOptionGraphicsItem *array;
  ulong uVar13;
  uint numItems;
  QStyleOptionGraphicsItem *option;
  qreal *pqVar14;
  undefined8 *puVar15;
  QRect *pQVar16;
  undefined8 uVar17;
  Representation RVar18;
  long lVar19;
  long in_FS_OFFSET;
  bool bVar20;
  byte bVar21;
  double dVar22;
  int iVar24;
  undefined1 auVar23 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  QPainterPath path;
  QTransform painterMatrix;
  QTransform moveMatrix;
  double local_1c8;
  double local_1b8;
  QRegion local_190;
  QList<QGraphicsItem_*> local_188;
  QPolygonF local_168;
  double local_148;
  qreal qStack_140;
  qreal local_138;
  qreal qStack_130;
  QRect local_128;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  ushort local_e0;
  QTransform local_d8;
  QRect local_88 [4];
  ushort local_40;
  long local_38;
  
  bVar21 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pDVar1 = (this_00->scene).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    bVar20 = false;
  }
  else {
    bVar20 = (this_00->scene).wp.value != (QObject *)0x0;
  }
  if (((painter != (QPainter *)0x0) && (bVar20)) &&
     (uVar4 = QPainter::isActive(), (char)uVar4 != '\0')) {
    uVar17._0_4_ = source->x1;
    uVar17._4_4_ = source->y1;
    lVar19._0_4_ = source->x2;
    lVar19._4_4_ = source->y2;
    auVar23._0_4_ = -(uint)((undefined4)lVar19 == (undefined4)uVar17 + -1);
    iVar24 = -(uint)(lVar19._4_4_ == uVar17._4_4_ + -1);
    auVar23._4_4_ = auVar23._0_4_;
    auVar23._8_4_ = iVar24;
    auVar23._12_4_ = iVar24;
    iVar5 = movmskpd(uVar4,auVar23);
    iVar24 = uVar17._4_4_;
    if (iVar5 == 3) {
      pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      pQVar2 = pQVar8->data;
      lVar19 = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                        (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
      uVar17 = 0;
      iVar24 = 0;
    }
    local_148 = target->xp;
    qStack_140 = target->yp;
    local_138 = target->w;
    qStack_130 = target->h;
    iVar5 = (int)uVar17;
    if (((target->w == 0.0) && (!NAN(target->w))) && ((target->h == 0.0 && (!NAN(target->h))))) {
      plVar9 = (long *)QPainter::device();
      iVar6 = (**(code **)(*plVar9 + 0x10))(plVar9);
      if (iVar6 == 5) {
        local_148 = (double)iVar5;
        qStack_140 = (qreal)iVar24;
        qStack_130 = (qreal)(((lVar19 >> 0x20) - (long)iVar24) + 1);
        local_138 = (double)(((long)(int)lVar19 - (long)iVar5) + 1);
      }
      else {
        plVar9 = (long *)QPainter::device();
        iVar6 = (**(code **)(*plVar9 + 0x20))(plVar9,1);
        plVar9 = (long *)QPainter::device();
        iVar7 = (**(code **)(*plVar9 + 0x20))(plVar9,2);
        qStack_130 = (qreal)iVar7;
        local_148 = 0.0;
        qStack_140 = 0.0;
        local_138 = (double)iVar6;
      }
    }
    local_88[0].x2.m_i = (int)lVar19 + 1;
    dVar25 = local_138 / (double)(local_88[0].x2.m_i - iVar5);
    RVar18.m_i = (int)((ulong)lVar19 >> 0x20) + 1;
    dVar26 = qStack_130 / (double)(RVar18.m_i - iVar24);
    local_1c8 = dVar25;
    local_1b8 = dVar26;
    if (aspectRatioMode == KeepAspectRatioByExpanding) {
      local_1c8 = dVar26;
      if (dVar26 <= dVar25) {
        local_1c8 = dVar25;
        local_1b8 = dVar25;
      }
    }
    else if ((aspectRatioMode == KeepAspectRatio) && (local_1b8 = dVar25, dVar26 <= dVar25)) {
      local_1c8 = dVar26;
      local_1b8 = dVar26;
    }
    local_168.super_QList<QPointF>.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_168.super_QList<QPointF>.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_168.super_QList<QPointF>.d.ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
    local_88[0].x1.m_i = iVar5 + -1;
    local_88[0].y1.m_i = iVar24 + -1;
    local_88[0].y2.m_i = RVar18.m_i;
    mapToScene(&local_168,this,local_88);
    local_188.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_188.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_188.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = (QGraphicsScene *)(this_00->scene).wp.value;
    puVar15 = &DAT_00704bb0;
    pQVar16 = local_88;
    for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
      uVar17 = *puVar15;
      pQVar16->x1 = (Representation)(int)uVar17;
      pQVar16->y1 = (Representation)(int)((ulong)uVar17 >> 0x20);
      puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
      pQVar16 = (QRect *)&pQVar16[-(ulong)bVar21].x2;
    }
    local_40 = local_40 & 0xfc00;
    QGraphicsScene::items
              (&local_188,this_01,&local_168,IntersectsItemBoundingRect,DescendingOrder,
               (QTransform *)local_88);
    qVar3 = local_188.d.size;
    pvVar10 = operator_new__(local_188.d.size * 8);
    numItems = (uint)qVar3;
    if (0 < (int)numItems) {
      uVar13 = (ulong)(numItems & 0x7fffffff);
      ppQVar11 = local_188.d.ptr;
      do {
        *(QGraphicsItem **)((long)pvVar10 + uVar13 * 8 + -8) = *ppQVar11;
        ppQVar11 = ppQVar11 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    QList<QGraphicsItem_*>::clear(&local_188);
    puVar15 = &DAT_00704bf8;
    pQVar16 = local_88;
    for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
      uVar17 = *puVar15;
      pQVar16->x1 = (Representation)(int)uVar17;
      pQVar16->y1 = (Representation)(int)((ulong)uVar17 >> 0x20);
      puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
      pQVar16 = (QRect *)&pQVar16[-(ulong)bVar21].x2;
    }
    if ((this_00->field_0x300 & 0x20) != 0) {
      QGraphicsViewPrivate::updateScroll(this_00);
    }
    lVar19 = this_00->scrollX;
    if ((this_00->field_0x300 & 0x20) != 0) {
      QGraphicsViewPrivate::updateScroll(this_00);
    }
    QTransform::fromTranslate((double)-lVar19,(double)-this_00->scrollY);
    pqVar14 = (qreal *)&DAT_00704bf8;
    pQVar12 = &local_d8;
    for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
      pQVar12->m_matrix[0][0] = *pqVar14;
      pqVar14 = pqVar14 + (ulong)bVar21 * -2 + 1;
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar21 * -2 + 1) * 8);
    }
    QTransform::operator*(&local_d8,&this_00->matrix);
    puVar15 = &DAT_00704bb0;
    pQVar16 = &local_128;
    for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
      uVar17 = *puVar15;
      pQVar16->x1 = (Representation)(int)uVar17;
      pQVar16->y1 = (Representation)(int)((ulong)uVar17 >> 0x20);
      puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
      pQVar16 = (QRect *)&pQVar16[-(ulong)bVar21].x2;
    }
    local_e0 = local_e0 & 0xfc00;
    QTransform::translate(local_148,qStack_140);
    QTransform::scale(local_1c8,local_1b8);
    pQVar12 = (QTransform *)QTransform::translate((double)-iVar5,(double)-iVar24);
    QTransform::operator*=(&local_d8,pQVar12);
    array = QGraphicsViewPrivate::allocStyleOptionsArray(this_00,numItems);
    if (0 < (int)numItems) {
      uVar13 = 0;
      option = array;
      do {
        dVar26 = (double)((ulong)local_148 & 0x8000000000000000 | 0x3fe0000000000000) + local_148;
        dVar25 = 2147483647.0;
        if (dVar26 <= 2147483647.0) {
          dVar25 = dVar26;
        }
        if (dVar25 <= -2147483648.0) {
          dVar25 = -2147483648.0;
        }
        local_128.x1.m_i = (int)dVar25;
        dVar27 = (double)((ulong)qStack_140 & 0x8000000000000000 | 0x3fe0000000000000) + qStack_140;
        dVar26 = 2147483647.0;
        if (dVar27 <= 2147483647.0) {
          dVar26 = dVar27;
        }
        if (dVar26 <= -2147483648.0) {
          dVar26 = -2147483648.0;
        }
        dVar27 = (local_148 - (double)(int)dVar25) * 0.5 + local_138;
        dVar27 = (double)((ulong)dVar27 & 0x8000000000000000 | 0x3fe0000000000000) + dVar27;
        dVar25 = 2147483647.0;
        if (dVar27 <= 2147483647.0) {
          dVar25 = dVar27;
        }
        if (dVar25 <= -2147483648.0) {
          dVar25 = -2147483648.0;
        }
        this_02 = *(QGraphicsItemPrivate **)(*(long *)((long)pvVar10 + uVar13 * 8) + 8);
        dVar22 = (qStack_140 - (double)(int)dVar26) * 0.5 + qStack_130;
        dVar22 = (double)((ulong)dVar22 & 0x8000000000000000 | 0x3fe0000000000000) + dVar22;
        dVar27 = 2147483647.0;
        if (dVar22 <= 2147483647.0) {
          dVar27 = dVar22;
        }
        if (dVar27 <= -2147483648.0) {
          dVar27 = -2147483648.0;
        }
        local_128.x2.m_i = (int)dVar25 + local_128.x1.m_i + -1;
        local_128.y1.m_i = (int)dVar26;
        local_128.y2.m_i = (int)dVar27 + (int)dVar26 + -1;
        QRegion::QRegion(&local_190,&local_128,Rectangle);
        QGraphicsItemPrivate::initStyleOption(this_02,option,&local_d8,&local_190,false);
        QRegion::~QRegion(&local_190);
        uVar13 = uVar13 + 1;
        option = option + 1;
      } while ((numItems & 0x7fffffff) != uVar13);
    }
    QPainter::save();
    QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_148);
    local_190.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)&local_190);
    QPainterPath::addPolygon((QPolygonF *)&local_190);
    QPainterPath::closeSubpath();
    QTransform::map((QPainterPath *)&local_128);
    QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_128);
    QPainterPath::~QPainterPath((QPainterPath *)&local_128);
    QPainter::setTransform((QTransform *)painter,SUB81(&local_d8,0));
    local_118 = 0xffffffff;
    uStack_114 = 0xffffffff;
    uStack_110 = 0xffffffff;
    uStack_10c = 0xffffffff;
    local_128.x1.m_i = -1;
    local_128.y1.m_i = -1;
    local_128.x2.m_i = -1;
    local_128.y2.m_i = -1;
    QPolygonF::boundingRect();
    (**(code **)(*(long *)this + 0x1c8))(this,painter,&local_128);
    (**(code **)(*(long *)this + 0x1d8))(this,painter,qVar3,pvVar10,array);
    (**(code **)(*(long *)this + 0x1d0))(this,painter,&local_128);
    operator_delete__(pvVar10);
    QGraphicsViewPrivate::freeStyleOptionsArray(this_00,array);
    QPainter::restore();
    QPainterPath::~QPainterPath((QPainterPath *)&local_190);
    if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (&(local_168.super_QList<QPointF>.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_168.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.super_QList<QPointF>.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::render(QPainter *painter, const QRectF &target, const QRect &source,
                           Qt::AspectRatioMode aspectRatioMode)
{
    // ### Switch to using the recursive rendering algorithm instead.

    Q_D(QGraphicsView);
    if (!d->scene || !(painter && painter->isActive()))
        return;

    // Default source rect = viewport rect
    QRect sourceRect = source;
    if (source.isNull())
        sourceRect = viewport()->rect();

    // Default target rect = device rect
    QRectF targetRect = target;
    if (target.isNull()) {
        if (painter->device()->devType() == QInternal::Picture)
            targetRect = sourceRect;
        else
            targetRect.setRect(0, 0, painter->device()->width(), painter->device()->height());
    }

    // Find the ideal x / y scaling ratio to fit \a source into \a target.
    qreal xratio = targetRect.width() / sourceRect.width();
    qreal yratio = targetRect.height() / sourceRect.height();

    // Scale according to the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Find all items to draw, and reverse the list (we want to draw
    // in reverse order).
    QPolygonF sourceScenePoly = mapToScene(sourceRect.adjusted(-1, -1, 1, 1));
    QList<QGraphicsItem *> itemList = d->scene->items(sourceScenePoly,
                                                      Qt::IntersectsItemBoundingRect);
    QGraphicsItem **itemArray = new QGraphicsItem *[itemList.size()];
    int numItems = itemList.size();
    for (int i = 0; i < numItems; ++i)
        itemArray[numItems - i - 1] = itemList.at(i);
    itemList.clear();

    // Setup painter matrix.
    QTransform moveMatrix = QTransform::fromTranslate(-d->horizontalScroll(), -d->verticalScroll());
    QTransform painterMatrix = d->matrix * moveMatrix;
    painterMatrix *= QTransform()
                     .translate(targetRect.left(), targetRect.top())
                     .scale(xratio, yratio)
                     .translate(-sourceRect.left(), -sourceRect.top());

    // Generate the style options
    QStyleOptionGraphicsItem *styleOptionArray = d->allocStyleOptionsArray(numItems);
    for (int i = 0; i < numItems; ++i)
        itemArray[i]->d_ptr->initStyleOption(&styleOptionArray[i], painterMatrix, targetRect.toRect());

    painter->save();

    // Clip in device coordinates to avoid QRegion transformations.
    painter->setClipRect(targetRect);
    QPainterPath path;
    path.addPolygon(sourceScenePoly);
    path.closeSubpath();
    painter->setClipPath(painterMatrix.map(path), Qt::IntersectClip);

    // Transform the painter.
    painter->setTransform(painterMatrix, true);

    // Render the scene.
    QRectF sourceSceneRect = sourceScenePoly.boundingRect();
    drawBackground(painter, sourceSceneRect);
    drawItems(painter, numItems, itemArray, styleOptionArray);
    drawForeground(painter, sourceSceneRect);

    delete [] itemArray;
    d->freeStyleOptionsArray(styleOptionArray);

    painter->restore();
}